

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O3

int __thiscall
NaPNStateSpace::verify
          (NaPNStateSpace *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  NaStateSpaceModel *pNVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 *puVar4;
  uint k;
  uint m;
  uint n;
  int local_1c;
  int local_18;
  int local_14;
  
  pNVar1 = this->m_pSSModel;
  if (pNVar1 == (NaStateSpaceModel *)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  (*(pNVar1->super_NaUnit).super_NaLogging._vptr_NaLogging[0x15])
            (pNVar1,&local_1c,&local_18,&local_14);
  pNVar3 = NaPetriCnOutput::data(&this->x);
  iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  if (iVar2 == local_14) {
    pNVar3 = NaPetriCnOutput::data(&this->y);
    iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (iVar2 == local_18) {
      pNVar3 = NaPetriCnInput::data(&this->u);
      iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == local_1c);
    }
  }
  return 0;
}

Assistant:

bool
NaPNStateSpace::verify ()
{
    bool    answer = true;
    unsigned n, m, k;

    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    m_pSSModel->GetDimensions(k, m, n);

    answer = answer && x.data().dim() == n;
    answer = answer && y.data().dim() == m;
    answer = answer && u.data().dim() == k;

    return answer;
}